

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O0

void test_repeated_func(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        t1,int num)

{
  bool bVar1;
  int iVar2;
  log_level lVar3;
  longlong lVar4;
  Logger *pLVar5;
  rep_conflict rVar6;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  duration<double,_std::ratio<1L,_1000L>_> local_48;
  int local_3c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_38;
  int tm_diff;
  time_point t2;
  longlong tid;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_18;
  int num_local;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1_local;
  
  tStack_18.__d.__r = t1.__d.__r;
  if ((test_repeated_func(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<long,long>>>,int)
       ::cnt == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_repeated_func(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<long,long>>>,int)
                                   ::cnt), iVar2 != 0)) {
    test_repeated_func::cnt = num;
    __cxa_guard_release(&test_repeated_func(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<long,long>>>,int)
                         ::cnt);
  }
  t2.__d.__r = (duration)std::this_thread::get_id();
  lVar4 = tid_to_ll((id *)&t2);
  tStack_38.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_50.__r = (rep)std::chrono::operator-(&stack0xffffffffffffffc8,&stack0xffffffffffffffe8);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_48,&local_50);
  rVar6 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_48);
  local_3c = (int)rVar6;
  pLVar5 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar5);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","test_repeated_func",0x11);
  }
  lVar3 = Logger::get_log_level();
  if (1 < (int)lVar3) {
    pLVar5 = Logger::get_instance();
    test_repeated_func::cnt = test_repeated_func::cnt + -1;
    Logger::write_log(pLVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/timer/tests/test_timer.cpp"
                      ,"test_repeated_func",0x11,LOG_LEVEL_INFO,
                      "[tid:%lld] hello, repeated_func! total repeated_cnt = %d, left cnt: %d, time diff is %d ms\n"
                      ,lVar4,num,test_repeated_func::cnt,local_3c);
    pLVar5 = Logger::get_instance();
    Logger::flush(pLVar5);
  }
  return;
}

Assistant:

void test_repeated_func(chrono::time_point<chrono::steady_clock> t1, int num)
{
    static int cnt = num;
    long long tid = tid_to_ll(this_thread::get_id());

    auto t2 = chrono::steady_clock::now();
    int tm_diff = static_cast<int>( chrono::duration<double, milli>(t2-t1).count() );
    LOG_INFO("[tid:%lld] hello, repeated_func! total repeated_cnt = %d, left cnt: %d, time diff is %d ms\n",
                                                                     tid, num, --cnt, tm_diff);    
}